

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O0

void __thiscall Node::Node(Node *this,Node *OldNode)

{
  Node *pNVar1;
  int local_1c;
  int loop;
  Node *OldNode_local;
  Node *this_local;
  
  std::__cxx11::string::string((string *)&this->TextValue);
  this->Type = OldNode->Type;
  std::__cxx11::string::operator=((string *)&this->TextValue,(string *)&OldNode->TextValue);
  this->FromInclude = OldNode->FromInclude;
  this->lineno = OldNode->lineno;
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    if (OldNode->Tree[local_1c] == (Node *)0x0) {
      this->Tree[local_1c] = (Node *)0x0;
    }
    else {
      pNVar1 = (Node *)operator_new(0x70);
      Node(pNVar1,OldNode->Tree[local_1c]);
      this->Tree[local_1c] = pNVar1;
    }
  }
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    if (OldNode->Block[local_1c] == (Node *)0x0) {
      this->Block[local_1c] = (Node *)0x0;
    }
    else {
      pNVar1 = (Node *)operator_new(0x70);
      Node(pNVar1,OldNode->Block[local_1c]);
      this->Block[local_1c] = pNVar1;
    }
  }
  return;
}

Assistant:

Node::Node(
	const Node &OldNode	/**< Node to copy */
)
{
	int loop;		// Generic loop variable

	//
	// Copy over all the easy bits
	//
	Type = OldNode.Type;
	TextValue = OldNode.TextValue;
	Level = OldNode.Level;
	FromInclude = OldNode.FromInclude;
	lineno = OldNode.lineno;

	//
	// Copy over tree entries
	//
	for (loop = 0; loop < 5; loop++)
	{
		if (OldNode.Tree[loop] == 0)
		{
			Tree[loop] = 0;
		}
		else
		{
			//
			// Recursive call here
			//
			Tree[loop] = new Node(*OldNode.Tree[loop]);
		}
	}

	//
	// Copy over block entries
	//
	//	Should we really copy over the block entries?
	//	This may proove to be rather a lot of stuff.
	//
	for (loop = 0; loop < 3; loop++)
	{
		if (OldNode.Block[loop] == 0)
		{
			Block[loop] = 0;
		}
		else
		{
			//
			// Recursive call here
			//
			Block[loop] = new Node(*OldNode.Block[loop]);
		}
	}
}